

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiColumnData *pIVar2;
  ImVec2 IVar3;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 != (ImGuiColumns *)0x0) {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    pIVar2 = (pIVar1->Columns).Data;
    return (pIVar1->OffMaxX - pIVar1->OffMinX) *
           (pIVar2[(long)column_index + 1].OffsetNorm - pIVar2[column_index].OffsetNorm);
  }
  IVar3 = GetContentRegionAvail();
  return IVar3.x;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}